

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_sha1.c
# Opt level: O2

void ngx_sha1_init(ngx_sha1_t *ctx)

{
  ctx->a = 0x67452301;
  ctx->b = 0xefcdab89;
  ctx->c = 0x98badcfe;
  ctx->d = 0x10325476;
  ctx->e = 0xc3d2e1f0;
  ctx->bytes = 0;
  return;
}

Assistant:

void
ngx_sha1_init(ngx_sha1_t *ctx)
{
    ctx->a = 0x67452301;
    ctx->b = 0xefcdab89;
    ctx->c = 0x98badcfe;
    ctx->d = 0x10325476;
    ctx->e = 0xc3d2e1f0;

    ctx->bytes = 0;
}